

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O0

void __thiscall autoSimplification_minus_Test::TestBody(autoSimplification_minus_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ExprPtr EVar3;
  AssertHelper local_120;
  Message local_118;
  shared_ptr<const_mathiu::impl::Expr> local_110;
  string local_100;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  Message local_c8;
  string local_c0;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  ExprPtr e;
  ExprPtr local_70;
  undefined1 local_60 [8];
  ExprPtr e2;
  ExprPtr local_40;
  ExprPtr local_30;
  undefined1 local_20 [8];
  ExprPtr e1;
  autoSimplification_minus_Test *this_local;
  
  e1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  mathiu::impl::operator____s((impl *)&local_30,"x",1);
  mathiu::impl::operator____i((impl *)&local_40,1);
  mathiu::impl::operator+((impl *)local_20,&local_30,&local_40);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_40);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_30);
  mathiu::impl::operator____s((impl *)&local_70,"x",1);
  mathiu::impl::operator____i
            ((impl *)&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,2);
  mathiu::impl::operator+
            ((impl *)local_60,&local_70,
             (ExprPtr *)
             &e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_70);
  EVar3 = mathiu::impl::operator-
                    ((impl *)&gtest_ar.message_,(ExprPtr *)local_20,(ExprPtr *)local_60);
  mathiu::impl::toString_abi_cxx11_
            (&local_c0,(impl *)&gtest_ar.message_,
             (ExprPtr *)
             EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[23],_nullptr>
            ((EqHelper *)local_a0,"toString(e)","\"(+ 1 x (* -1 (+ 2 x)))\"",&local_c0,
             (char (*) [23])"(+ 1 x (* -1 (+ 2 x)))");
  std::__cxx11::string::~string((string *)&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x2b8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  EVar3 = mathiu::impl::expand((impl *)&local_110,(ExprPtr *)&gtest_ar.message_);
  mathiu::impl::toString_abi_cxx11_
            (&local_100,(impl *)&local_110,
             (ExprPtr *)
             EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_e0,"toString(expand(e))","\"-1\"",&local_100,(char (*) [3])0x3c49c5);
  std::__cxx11::string::~string((string *)&local_100);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x2b9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_60);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_20);
  return;
}

Assistant:

TEST(autoSimplification, minus)
{
    auto const e1 = "x"_s + 1_i;
    auto const e2 = "x"_s + 2_i;
    auto const e = e1 - e2;
    EXPECT_EQ(toString(e), "(+ 1 x (* -1 (+ 2 x)))");
    EXPECT_EQ(toString(expand(e)), "-1");
}